

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

SIMDExtractOp __thiscall
wasm::Random::pick<wasm::SIMDExtractOp>(Random *this,FeatureOptions<wasm::SIMDExtractOp> *picker)

{
  SIMDExtractOp SVar1;
  value_type *pvVar2;
  vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_> local_30;
  FeatureOptions<wasm::SIMDExtractOp> *local_18;
  FeatureOptions<wasm::SIMDExtractOp> *picker_local;
  Random *this_local;
  
  local_18 = picker;
  picker_local = (FeatureOptions<wasm::SIMDExtractOp> *)this;
  items<wasm::SIMDExtractOp>(&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::SIMDExtractOp,std::allocator<wasm::SIMDExtractOp>>>
                     (this,&local_30);
  SVar1 = *pvVar2;
  std::vector<wasm::SIMDExtractOp,_std::allocator<wasm::SIMDExtractOp>_>::~vector(&local_30);
  return SVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }